

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsPublication
helicsFederateRegisterGlobalTypePublication
          (HelicsFederate fed,char *key,char *type,char *units,HelicsError *err)

{
  string_view type_00;
  string_view name;
  bool bVar1;
  Publication *pPVar2;
  pointer pPVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *in_RDI;
  __sv_type _Var4;
  __single_object pub;
  shared_ptr<helics::ValueFederate> fedObj;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  HelicsFederate in_stack_ffffffffffffff48;
  ValueFederate *in_stack_ffffffffffffff70;
  shared_ptr<helics::ValueFederate> *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
  *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  string_view in_stack_ffffffffffffffa0;
  __shared_ptr local_40 [24];
  long local_28;
  long local_20;
  long local_18;
  unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *local_10;
  HelicsPublication local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  getValueFedSharedPtr(in_stack_ffffffffffffff48,(HelicsError *)in_stack_ffffffffffffff40);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_40);
  if (bVar1) {
    std::make_unique<helics::PublicationObject>();
    std::__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::ValueFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1cbff5);
    if (local_18 == 0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff90 = (char *)_Var4._M_len;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (local_20 == 0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff80 = (char *)_Var4._M_len;
      in_stack_ffffffffffffff88 =
           (unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_> *
           )_Var4._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    if (local_28 == 0) {
      _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_ffffffffffffff30);
      in_stack_ffffffffffffff70 = (ValueFederate *)_Var4._M_len;
      in_stack_ffffffffffffff78 = (shared_ptr<helics::ValueFederate> *)_Var4._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
    name._M_str = in_stack_ffffffffffffff90;
    name._M_len = (size_t)in_stack_ffffffffffffff88;
    type_00._M_str = in_stack_ffffffffffffff80;
    type_00._M_len = (size_t)in_stack_ffffffffffffff78;
    pPVar2 = helics::ValueFederate::registerGlobalPublication
                       (in_stack_ffffffffffffff70,name,type_00,in_stack_ffffffffffffffa0);
    pPVar3 = std::
             unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
             ::operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                           *)0x1cc0db);
    pPVar3->pubPtr = pPVar2;
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    operator->((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)0x1cc0ee);
    std::shared_ptr<helics::ValueFederate>::operator=
              (in_stack_ffffffffffffff78,
               (shared_ptr<helics::ValueFederate> *)in_stack_ffffffffffffff70);
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    unique_ptr((unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)in_stack_ffffffffffffff78,
               (unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>
                *)in_stack_ffffffffffffff70);
    local_8 = anon_unknown.dwarf_5d1c2::addPublication
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    ~unique_ptr(local_10);
    std::unique_ptr<helics::PublicationObject,_std::default_delete<helics::PublicationObject>_>::
    ~unique_ptr(local_10);
  }
  else {
    local_8 = (HelicsPublication)0x0;
  }
  std::shared_ptr<helics::ValueFederate>::~shared_ptr((shared_ptr<helics::ValueFederate> *)0x1cc224)
  ;
  return local_8;
}

Assistant:

HelicsPublication
    helicsFederateRegisterGlobalTypePublication(HelicsFederate fed, const char* key, const char* type, const char* units, HelicsError* err)
{
    // now generate a generic input
    auto fedObj = getValueFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    try {
        auto pub = std::make_unique<helics::PublicationObject>();
        pub->pubPtr = &fedObj->registerGlobalPublication(AS_STRING_VIEW(key), AS_STRING_VIEW(type), AS_STRING_VIEW(units));
        pub->fedptr = std::move(fedObj);
        return addPublication(fed, std::move(pub));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}